

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

int resolveLocal(Compiler *compiler,Token *name)

{
  _Bool _Var1;
  Token *a;
  long in_RDI;
  Local *local;
  int i;
  int local_1c;
  
  local_1c = *(int *)(in_RDI + 0x2018);
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return -1;
    }
    a = (Token *)(in_RDI + 0x18 + (long)local_1c * 0x20);
    _Var1 = identifiersEqual(a,(Token *)0x106cee);
  } while (!_Var1);
  if (a[1].type == ~TOKEN_LEFT_PAREN) {
    error((char *)0x106d0a);
  }
  return local_1c;
}

Assistant:

static int resolveLocal(Compiler *compiler, Token *name) {
    for (int i = compiler->localCount - 1; i >= 0; i--) {
        Local *local = &compiler->locals[i];
        if (identifiersEqual(name, &local->name)) {
            if (local->depth == -1) {
                error("Cannot read local variable in its own initializer.");
            }
            return i;
        }
    }

    return -1;
}